

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64AddressingModes.h
# Opt level: O2

_Bool AArch64_AM_isValidDecodeLogicalImmediate(uint64_t val,uint regSize)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  
  uVar3 = val >> 0xc & 0xfffff;
  if ((regSize == 0x20 & (byte)uVar3) == 0) {
    uVar5 = (uint)val & 0x3f;
    uVar2 = (((uint)uVar3 & 1) << 6 | uVar5) ^ 0x3f;
    iVar1 = 0x21;
    do {
      iVar4 = iVar1;
      if (iVar4 == 2) break;
      bVar6 = uVar2 != 0;
      uVar2 = uVar2 >> 1;
      iVar1 = iVar4 + -1;
    } while (bVar6);
    if (iVar4 + -0x21 < 0) {
      return (uVar5 | -(0x80000000U >> ((byte)(iVar4 + -1) & 0x1f))) != 0xffffffff;
    }
  }
  return false;
}

Assistant:

static inline bool AArch64_AM_isValidDecodeLogicalImmediate(uint64_t val, unsigned regSize)
{
	unsigned size;
	unsigned S;
	int len;
	// Extract the N and imms fields needed for checking.
	unsigned N = (val >> 12) & 1;
	unsigned imms = val & 0x3f;

	if (regSize == 32 && N != 0) // undefined logical immediate encoding
		return false;
	len = 31 - countLeadingZeros((N << 6) | (~imms & 0x3f));
	if (len < 0) // undefined logical immediate encoding
		return false;
	size = (1 << len);
	S = imms & (size - 1);
	if (S == size - 1) // undefined logical immediate encoding
		return false;

	return true;
}